

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O0

void __thiscall Gluco::SimpSolver::SimpSolver(SimpSolver *this)

{
  CRef CVar1;
  int32_t *piVar2;
  double *pdVar3;
  bool *pbVar4;
  undefined1 local_40 [8];
  vec<Gluco::Lit> dummy;
  ClauseDeleted local_28 [3];
  SimpSolver *local_10;
  SimpSolver *this_local;
  
  local_10 = this;
  Solver::Solver(&this->super_Solver);
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__SimpSolver_00fb5ca8;
  piVar2 = IntOption::operator_cast_to_int_(&opt_grow);
  this->grow = *piVar2;
  piVar2 = IntOption::operator_cast_to_int_(&opt_clause_lim);
  this->clause_lim = *piVar2;
  piVar2 = IntOption::operator_cast_to_int_(&opt_subsumption_lim);
  this->subsumption_lim = *piVar2;
  pdVar3 = DoubleOption::operator_cast_to_double_(&opt_simp_garbage_frac);
  this->simp_garbage_frac = *pdVar3;
  pbVar4 = BoolOption::operator_cast_to_bool_(&opt_use_asymm);
  this->use_asymm = (bool)(*pbVar4 & 1);
  pbVar4 = BoolOption::operator_cast_to_bool_(&opt_use_rcheck);
  this->use_rcheck = (bool)(*pbVar4 & 1);
  pbVar4 = BoolOption::operator_cast_to_bool_(&opt_use_elim);
  this->use_elim = (bool)(*pbVar4 & 1);
  this->merges = 0;
  this->asymm_lits = 0;
  this->eliminated_vars = 0;
  this->eliminated_clauses = 0;
  this->elimorder = 1;
  this->use_simplification = true;
  vec<unsigned_int>::vec(&this->elimclauses);
  vec<char>::vec(&this->touched);
  ClauseDeleted::ClauseDeleted(local_28,&(this->super_Solver).ca);
  OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted>::OccLists
            (&this->occurs,local_28);
  vec<int>::vec(&this->n_occ);
  ElimLt::ElimLt((ElimLt *)&dummy.sz,&this->n_occ);
  Heap<Gluco::SimpSolver::ElimLt>::Heap(&this->elim_heap,(ElimLt *)&dummy.sz);
  Queue<unsigned_int>::Queue(&this->subsumption_queue);
  vec<char>::vec(&this->frozen);
  vec<char>::vec(&this->eliminated);
  this->bwdsub_assigns = 0;
  this->n_touched = 0;
  vec<Gluco::Lit>::vec((vec<Gluco::Lit> *)local_40,1,(Lit *)&lit_Undef);
  (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.field_0x14 = 1;
  CVar1 = ClauseAllocator::alloc<Gluco::vec<Gluco::Lit>>
                    (&(this->super_Solver).ca,(vec<Gluco::Lit> *)local_40,false);
  this->bwdsub_tmpunit = CVar1;
  (this->super_Solver).remove_satisfied = false;
  vec<Gluco::Lit>::~vec((vec<Gluco::Lit> *)local_40);
  return;
}

Assistant:

SimpSolver::SimpSolver() :
    grow               (opt_grow)
  , clause_lim         (opt_clause_lim)
  , subsumption_lim    (opt_subsumption_lim)
  , simp_garbage_frac  (opt_simp_garbage_frac)
  , use_asymm          (opt_use_asymm)
  , use_rcheck         (opt_use_rcheck)
  , use_elim           (opt_use_elim)
  , merges             (0)
  , asymm_lits         (0)
  , eliminated_vars    (0)
  , eliminated_clauses (0)
  , elimorder          (1)
  , use_simplification (true)
  , occurs             (ClauseDeleted(ca))
  , elim_heap          (ElimLt(n_occ))
  , bwdsub_assigns     (0)
  , n_touched          (0)
{
    vec<Lit> dummy(1,lit_Undef);
    ca.extra_clause_field = true; // NOTE: must happen before allocating the dummy clause below.
    bwdsub_tmpunit        = ca.alloc(dummy);
    remove_satisfied      = false;
}